

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3AddColumn(Parse *pParse,Token sName,Token sType)

{
  short sVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  Table *pTVar4;
  sqlite3 *db;
  char cVar5;
  int iVar6;
  byte *z;
  byte *pbVar7;
  long lVar8;
  Column *pCVar9;
  size_t sVar10;
  ulong uVar11;
  byte bVar12;
  char *zLeft;
  long lVar13;
  uint uVar14;
  char cVar15;
  uint uVar16;
  char *pcVar17;
  u64 n;
  Column *pCol;
  uchar uVar18;
  ulong uVar19;
  long lVar20;
  uchar uVar21;
  u8 uVar22;
  char **ppcVar23;
  u8 uVar24;
  Token local_58;
  Token local_48;
  ulong local_38;
  
  zLeft = sType.z;
  local_58.z = sName.z;
  local_58.n = sName.n;
  uVar14 = sType.n;
  pTVar4 = pParse->pNewTable;
  if (pTVar4 == (Table *)0x0) {
    return;
  }
  db = pParse->db;
  local_48.z = zLeft;
  local_48.n = uVar14;
  if (db->aLimit[2] <= (int)pTVar4->nCol) {
    sqlite3ErrorMsg(pParse,"too many columns on %s",pTVar4->zName);
    return;
  }
  if (pParse->eParseMode < 2) {
    sqlite3DequoteToken(&local_58);
  }
  if (uVar14 < 0x10) {
LAB_001588be:
    local_38 = (ulong)uVar14;
LAB_001588c1:
    if ((uint)local_38 < 3) goto LAB_00158925;
  }
  else if (zLeft != (char *)0x0) {
    uVar11 = (ulong)(uVar14 - 6);
    lVar13 = 0;
    do {
      if ((ulong)(byte)zLeft[lVar13 + uVar11] == 0) {
        uVar21 = ""[(byte)"always"[lVar13]];
        uVar18 = '\0';
LAB_0015880f:
        if (uVar18 != uVar21) goto LAB_001588be;
        break;
      }
      uVar18 = ""[(byte)zLeft[lVar13 + uVar11]];
      uVar21 = ""[(byte)"always"[lVar13]];
      if (uVar18 != uVar21) goto LAB_0015880f;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 6);
    local_38 = 0;
    uVar19 = 0;
    pcVar17 = zLeft;
    do {
      pcVar17 = pcVar17 + -1;
      if (uVar11 == uVar19) goto LAB_00158925;
      uVar19 = uVar19 + 1;
    } while ((""[(byte)pcVar17[uVar11]] & 1) != 0);
    uVar16 = (uVar14 - 5) - (int)uVar19;
    if ((uVar11 - uVar19) + 1 < 9) {
LAB_00158bb1:
      local_38 = (ulong)uVar16;
      local_48.n = uVar16;
    }
    else {
      local_38 = (uVar14 - 0xd) - uVar19;
      uVar14 = (uVar14 - 0xe) - (int)uVar19;
      lVar13 = 0;
      do {
        if ((ulong)(byte)zLeft[lVar13 + (ulong)uVar14] == 0) {
          uVar21 = ""[(byte)"generated"[lVar13]];
          uVar18 = '\0';
LAB_00158b81:
          if (uVar18 != uVar21) goto LAB_00158bb1;
          break;
        }
        uVar18 = ""[(byte)zLeft[lVar13 + (ulong)uVar14]];
        uVar21 = ""[(byte)"generated"[lVar13]];
        if (uVar18 != uVar21) goto LAB_00158b81;
        lVar13 = lVar13 + 1;
      } while (lVar13 != 9);
      uVar11 = (ulong)uVar14;
      do {
        if (uVar11 == 0) {
          local_38 = 0;
          local_48.n = uVar16;
          goto LAB_00158925;
        }
        lVar13 = uVar11 - 1;
        local_48.n = (int)local_38 - 1;
        local_38 = (ulong)local_48.n;
        uVar11 = uVar11 - 1;
      } while ((""[(byte)zLeft[lVar13]] & 1) != 0);
    }
    goto LAB_001588c1;
  }
  sqlite3DequoteToken(&local_48);
  uVar14 = local_48.n;
  zLeft = local_48.z;
  local_38 = (ulong)local_48.n;
  cVar15 = '\x10';
  ppcVar23 = sqlite3StdType;
  lVar13 = 0;
  do {
    if ((uVar14 == "\x03\x04\x03\a\x04\x04"[lVar13]) &&
       (iVar6 = sqlite3_strnicmp(zLeft,*ppcVar23,uVar14), iVar6 == 0)) {
      cVar5 = "CADDEB"[lVar13];
      uVar24 = (((uint)lVar13 & 3) == 1) * '\x04' + '\x01';
      local_38 = 0;
      goto LAB_00158927;
    }
    lVar13 = lVar13 + 1;
    cVar15 = cVar15 + '\x10';
    ppcVar23 = ppcVar23 + 1;
  } while (lVar13 != 6);
LAB_00158925:
  uVar24 = '\x01';
  cVar5 = 'A';
  cVar15 = '\0';
LAB_00158927:
  uVar11 = (ulong)local_58.n;
  n = (local_38 - ((int)local_38 == 0)) + uVar11 + 2;
  if (db == (sqlite3 *)0x0) {
    z = (byte *)sqlite3Malloc(n);
  }
  else {
    z = (byte *)sqlite3DbMallocRawNN(db,n);
  }
  if (z != (byte *)0x0) {
    if (1 < pParse->eParseMode) {
      sqlite3RenameTokenMap(pParse,z,&local_58);
    }
    memcpy(z,local_58.z,uVar11);
    z[uVar11] = 0;
    sqlite3Dequote((char *)z);
    bVar12 = *z;
    if (bVar12 == 0) {
      uVar22 = '\0';
    }
    else {
      uVar22 = '\0';
      pbVar7 = z;
      do {
        pbVar7 = pbVar7 + 1;
        uVar22 = uVar22 + ""[bVar12];
        bVar12 = *pbVar7;
      } while (bVar12 != 0);
    }
    lVar13 = (long)pTVar4->nCol;
    if (lVar13 < 1) {
      pCVar9 = pTVar4->aCol;
    }
    else {
      pCVar9 = pTVar4->aCol;
      lVar8 = 0;
      do {
        if (pCVar9[lVar8].hName == uVar22) {
          lVar20 = 0;
          do {
            bVar12 = z[lVar20];
            if (bVar12 == pCVar9[lVar8].zCnName[lVar20]) {
              if ((ulong)bVar12 == 0) {
                sqlite3ErrorMsg(pParse,"duplicate column name: %s",z);
                goto LAB_00158afc;
              }
            }
            else if (""[bVar12] != ""[(byte)pCVar9[lVar8].zCnName[lVar20]]) break;
            lVar20 = lVar20 + 1;
          } while( true );
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != lVar13);
    }
    pCVar9 = (Column *)sqlite3DbRealloc(db,pCVar9,lVar13 * 0x10 + 0x10);
    uVar11 = local_38;
    if (pCVar9 == (Column *)0x0) {
LAB_00158afc:
      sqlite3DbFreeNN(db,z);
      return;
    }
    pTVar4->aCol = pCVar9;
    sVar1 = pTVar4->nCol;
    pCol = pCVar9 + sVar1;
    *(undefined8 *)&pCVar9[sVar1].field_0x8 = 0;
    pCVar9[sVar1].zCnName = (char *)z;
    pCVar9[sVar1].hName = uVar22;
    if (local_38 == 0) {
      pCol->field_0x8 = cVar15;
      pCol->szEst = uVar24;
    }
    else {
      sVar10 = strlen((char *)z);
      uVar19 = (ulong)((uint)sVar10 & 0x3fffffff);
      pbVar7 = z + uVar19 + 1;
      memcpy(pbVar7,zLeft,uVar11);
      z[uVar11 + 1 + uVar19] = 0;
      sqlite3Dequote((char *)pbVar7);
      cVar5 = sqlite3AffinityType((char *)pbVar7,pCol);
      *(byte *)&pCol->colFlags = (byte)pCol->colFlags | 4;
    }
    pCol->affinity = cVar5;
    uVar2 = pTVar4->nCol;
    uVar3 = pTVar4->nNVCol;
    pTVar4->nCol = uVar2 + 1;
    pTVar4->nNVCol = uVar3 + 1;
    (pParse->constraintName).n = 0;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AddColumn(Parse *pParse, Token sName, Token sType){
  Table *p;
  int i;
  char *z;
  char *zType;
  Column *pCol;
  sqlite3 *db = pParse->db;
  u8 hName;
  Column *aNew;
  u8 eType = COLTYPE_CUSTOM;
  u8 szEst = 1;
  char affinity = SQLITE_AFF_BLOB;

  if( (p = pParse->pNewTable)==0 ) return;
  if( p->nCol+1>db->aLimit[SQLITE_LIMIT_COLUMN] ){
    sqlite3ErrorMsg(pParse, "too many columns on %s", p->zName);
    return;
  }
  if( !IN_RENAME_OBJECT ) sqlite3DequoteToken(&sName);

  /* Because keywords GENERATE ALWAYS can be converted into identifiers
  ** by the parser, we can sometimes end up with a typename that ends
  ** with "generated always".  Check for this case and omit the surplus
  ** text. */
  if( sType.n>=16
   && sqlite3_strnicmp(sType.z+(sType.n-6),"always",6)==0
  ){
    sType.n -= 6;
    while( ALWAYS(sType.n>0) && sqlite3Isspace(sType.z[sType.n-1]) ) sType.n--;
    if( sType.n>=9
     && sqlite3_strnicmp(sType.z+(sType.n-9),"generated",9)==0
    ){
      sType.n -= 9;
      while( sType.n>0 && sqlite3Isspace(sType.z[sType.n-1]) ) sType.n--;
    }
  }

  /* Check for standard typenames.  For standard typenames we will
  ** set the Column.eType field rather than storing the typename after
  ** the column name, in order to save space. */
  if( sType.n>=3 ){
    sqlite3DequoteToken(&sType);
    for(i=0; i<SQLITE_N_STDTYPE; i++){
       if( sType.n==sqlite3StdTypeLen[i]
        && sqlite3_strnicmp(sType.z, sqlite3StdType[i], sType.n)==0
       ){
         sType.n = 0;
         eType = i+1;
         affinity = sqlite3StdTypeAffinity[i];
         if( affinity<=SQLITE_AFF_TEXT ) szEst = 5;
         break;
       }
    }
  }

  z = sqlite3DbMallocRaw(db, (i64)sName.n + 1 + (i64)sType.n + (sType.n>0) );
  if( z==0 ) return;
  if( IN_RENAME_OBJECT ) sqlite3RenameTokenMap(pParse, (void*)z, &sName);
  memcpy(z, sName.z, sName.n);
  z[sName.n] = 0;
  sqlite3Dequote(z);
  hName = sqlite3StrIHash(z);
  for(i=0; i<p->nCol; i++){
    if( p->aCol[i].hName==hName && sqlite3StrICmp(z, p->aCol[i].zCnName)==0 ){
      sqlite3ErrorMsg(pParse, "duplicate column name: %s", z);
      sqlite3DbFree(db, z);
      return;
    }
  }
  aNew = sqlite3DbRealloc(db,p->aCol,((i64)p->nCol+1)*sizeof(p->aCol[0]));
  if( aNew==0 ){
    sqlite3DbFree(db, z);
    return;
  }
  p->aCol = aNew;
  pCol = &p->aCol[p->nCol];
  memset(pCol, 0, sizeof(p->aCol[0]));
  pCol->zCnName = z;
  pCol->hName = hName;
  sqlite3ColumnPropertiesFromName(p, pCol);

  if( sType.n==0 ){
    /* If there is no type specified, columns have the default affinity
    ** 'BLOB' with a default size of 4 bytes. */
    pCol->affinity = affinity;
    pCol->eCType = eType;
    pCol->szEst = szEst;
#ifdef SQLITE_ENABLE_SORTER_REFERENCES
    if( affinity==SQLITE_AFF_BLOB ){
      if( 4>=sqlite3GlobalConfig.szSorterRef ){
        pCol->colFlags |= COLFLAG_SORTERREF;
      }
    }
#endif
  }else{
    zType = z + sqlite3Strlen30(z) + 1;
    memcpy(zType, sType.z, sType.n);
    zType[sType.n] = 0;
    sqlite3Dequote(zType);
    pCol->affinity = sqlite3AffinityType(zType, pCol);
    pCol->colFlags |= COLFLAG_HASTYPE;
  }
  p->nCol++;
  p->nNVCol++;
  pParse->constraintName.n = 0;
}